

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O0

void glmc_rotate_make(vec4 *m,float angle,float *axis)

{
  float *in_RSI;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float c;
  vec3 vs;
  vec3 v;
  vec3 axisn;
  float norm;
  float local_108;
  float local_104;
  float local_100;
  float local_f8;
  float local_f4;
  float local_f0;
  float *local_e8;
  float local_dc;
  float *local_d8;
  float local_cc;
  float *local_c8;
  float *local_c0;
  float *local_b8;
  float local_ac;
  float *local_a8;
  float *local_40;
  float local_34;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  float *local_10;
  float *local_8;
  
  local_e8 = in_RSI;
  local_dc = in_XMM0_Da;
  local_d8 = in_RDI;
  fVar1 = cosf(in_XMM0_Da);
  local_c0 = local_e8;
  local_c8 = &local_f8;
  local_28 = local_e8;
  local_18 = local_e8;
  local_8 = local_e8;
  local_10 = local_e8;
  local_cc = sqrtf(local_e8[2] * local_e8[2] + *local_e8 * *local_e8 + local_e8[1] * local_e8[1]);
  if (local_cc < 1.1920929e-07) {
    local_20 = local_c8;
    local_c8[2] = 0.0;
    local_20[1] = 0.0;
    *local_20 = 0.0;
  }
  else {
    local_ac = 1.0 / local_cc;
    local_a8 = local_c0;
    local_b8 = local_c8;
    *local_c8 = *local_c0 * local_ac;
    local_b8[1] = local_a8[1] * local_ac;
    local_b8[2] = local_a8[2] * local_ac;
  }
  local_34 = 1.0 - fVar1;
  local_30 = &local_f8;
  local_40 = &local_108;
  local_108 = local_f8 * local_34;
  local_104 = local_f4 * local_34;
  local_100 = local_f0 * local_34;
  fVar2 = sinf(local_dc);
  *local_d8 = local_f8 * local_108;
  local_d8[1] = local_f4 * local_108;
  local_d8[2] = local_f0 * local_108;
  local_d8[4] = local_f8 * local_104;
  local_d8[5] = local_f4 * local_104;
  local_d8[6] = local_f0 * local_104;
  local_d8[8] = local_f8 * local_100;
  local_d8[9] = local_f4 * local_100;
  local_d8[10] = local_f0 * local_100;
  *local_d8 = fVar1 + *local_d8;
  local_d8[4] = local_d8[4] - local_f0 * fVar2;
  local_d8[8] = local_f4 * fVar2 + local_d8[8];
  local_d8[1] = local_f0 * fVar2 + local_d8[1];
  local_d8[5] = fVar1 + local_d8[5];
  local_d8[9] = local_d8[9] - local_f8 * fVar2;
  local_d8[2] = local_d8[2] - local_f4 * fVar2;
  local_d8[6] = local_f8 * fVar2 + local_d8[6];
  local_d8[10] = fVar1 + local_d8[10];
  local_d8[0xe] = 0.0;
  local_d8[0xd] = 0.0;
  local_d8[0xc] = 0.0;
  local_d8[0xb] = 0.0;
  local_d8[7] = 0.0;
  local_d8[3] = 0.0;
  local_d8[0xf] = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotate_make(mat4 m, float angle, vec3 axis) {
  glm_rotate_make(m, angle, axis);
}